

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

int bigcomp(U *rv,char *s0,BCinfo *bc)

{
  char cVar1;
  int iVar2;
  double dVar3;
  int local_6c;
  int local_58;
  int p5;
  int p2;
  int odd;
  int nd0;
  int nd;
  int i;
  int dd;
  int d2;
  int b2;
  Bigint *d;
  Bigint *b;
  BCinfo *bc_local;
  char *s0_local;
  U *rv_local;
  
  odd = bc->nd;
  p2 = bc->nd0;
  iVar2 = odd + bc->e0;
  b = (Bigint *)bc;
  bc_local = (BCinfo *)s0;
  s0_local = (char *)rv;
  d = sd2b(rv,bc->scale,&local_58);
  if (d == (Bigint *)0x0) {
    rv_local._4_4_ = -1;
  }
  else {
    p5 = d->x[0] & 1;
    d = lshift(d,1);
    if (d == (Bigint *)0x0) {
      rv_local._4_4_ = -1;
    }
    else {
      d->x[0] = d->x[0] | 1;
      local_58 = (local_58 + -1) - iVar2;
      _d2 = i2b(1);
      if (_d2 == (Bigint *)0x0) {
        Bfree(d);
        rv_local._4_4_ = -1;
      }
      else {
        if (iVar2 < 1) {
          if ((iVar2 < 0) && (d = pow5mult(d,-iVar2), d == (Bigint *)0x0)) {
            Bfree(_d2);
            return -1;
          }
        }
        else {
          _d2 = pow5mult(_d2,iVar2);
          if (_d2 == (Bigint *)0x0) {
            Bfree(d);
            return -1;
          }
        }
        if (local_58 < 1) {
          dd = 0;
          i = -local_58;
        }
        else {
          dd = local_58;
          i = 0;
        }
        nd0 = dshift(_d2,i);
        dd = nd0 + dd;
        if ((dd < 1) || (d = lshift(d,dd), d != (Bigint *)0x0)) {
          i = nd0 + i;
          if ((i < 1) || (_d2 = lshift(_d2,i), _d2 != (Bigint *)0x0)) {
            iVar2 = cmp(d,_d2);
            if (iVar2 < 0) {
              nd0 = 0;
              while (d = multadd(d,10,0), d != (Bigint *)0x0) {
                if (nd0 < p2) {
                  local_6c = nd0;
                }
                else {
                  local_6c = nd0 + 1;
                }
                cVar1 = *(char *)((long)&bc_local->e0 + (long)local_6c);
                iVar2 = quorem(d,_d2);
                nd = (cVar1 + -0x30) - iVar2;
                nd0 = nd0 + 1;
                if (nd != 0) goto LAB_0011ea54;
                if ((d->x[0] == 0) && (d->wds == 1)) {
                  nd = (int)(nd0 < odd);
                  goto LAB_0011ea54;
                }
                if (odd <= nd0) {
                  nd = -1;
                  goto LAB_0011ea54;
                }
                nd = 0;
              }
              Bfree(_d2);
              rv_local._4_4_ = -1;
            }
            else {
              nd = -1;
LAB_0011ea54:
              Bfree(d);
              Bfree(_d2);
              if ((0 < nd) || ((nd == 0 && (p5 != 0)))) {
                dVar3 = sulp((U *)s0_local,(BCinfo *)b);
                *(double *)s0_local = dVar3 + *(double *)s0_local;
              }
              rv_local._4_4_ = 0;
            }
          }
          else {
            Bfree(d);
            rv_local._4_4_ = -1;
          }
        }
        else {
          Bfree(_d2);
          rv_local._4_4_ = -1;
        }
      }
    }
  }
  return rv_local._4_4_;
}

Assistant:

static int
bigcomp(U *rv, const char *s0, BCinfo *bc)
{
    Bigint *b, *d;
    int b2, d2, dd, i, nd, nd0, odd, p2, p5;

    nd = bc->nd;
    nd0 = bc->nd0;
    p5 = nd + bc->e0;
    b = sd2b(rv, bc->scale, &p2);
    if (b == NULL)
        return -1;

    /* record whether the lsb of rv/2^(bc->scale) is odd:  in the exact halfway
       case, this is used for round to even. */
    odd = b->x[0] & 1;

    /* left shift b by 1 bit and or a 1 into the least significant bit;
       this gives us b * 2**p2 = rv/2^(bc->scale) + 0.5 ulp. */
    b = lshift(b, 1);
    if (b == NULL)
        return -1;
    b->x[0] |= 1;
    p2--;

    p2 -= p5;
    d = i2b(1);
    if (d == NULL) {
        Bfree(b);
        return -1;
    }
    /* Arrange for convenient computation of quotients:
     * shift left if necessary so divisor has 4 leading 0 bits.
     */
    if (p5 > 0) {
        d = pow5mult(d, p5);
        if (d == NULL) {
            Bfree(b);
            return -1;
        }
    }
    else if (p5 < 0) {
        b = pow5mult(b, -p5);
        if (b == NULL) {
            Bfree(d);
            return -1;
        }
    }
    if (p2 > 0) {
        b2 = p2;
        d2 = 0;
    }
    else {
        b2 = 0;
        d2 = -p2;
    }
    i = dshift(d, d2);
    if ((b2 += i) > 0) {
        b = lshift(b, b2);
        if (b == NULL) {
            Bfree(d);
            return -1;
        }
    }
    if ((d2 += i) > 0) {
        d = lshift(d, d2);
        if (d == NULL) {
            Bfree(b);
            return -1;
        }
    }

    /* Compare s0 with b/d: set dd to -1, 0, or 1 according as s0 < b/d, s0 ==
     * b/d, or s0 > b/d.  Here the digits of s0 are thought of as representing
     * a number in the range [0.1, 1). */
    if (cmp(b, d) >= 0)
        /* b/d >= 1 */
        dd = -1;
    else {
        i = 0;
        for(;;) {
            b = multadd(b, 10, 0);
            if (b == NULL) {
                Bfree(d);
                return -1;
            }
            dd = s0[i < nd0 ? i : i+1] - '0' - quorem(b, d);
            i++;

            if (dd)
                break;
            if (!b->x[0] && b->wds == 1) {
                /* b/d == 0 */
                dd = i < nd;
                break;
            }
            if (!(i < nd)) {
                /* b/d != 0, but digits of s0 exhausted */
                dd = -1;
                break;
            }
        }
    }
    Bfree(b);
    Bfree(d);
    if (dd > 0 || (dd == 0 && odd))
        dval(rv) += sulp(rv, bc);
    return 0;
}